

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ChangeFlag
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  FString *other;
  bool bVar1;
  bool local_57;
  bool value;
  FString flagname;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b4,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b4,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  flagname.Chars = *(char **)&param->field_0;
  local_57 = true;
  if ((DObject *)flagname.Chars != (DObject *)0x0) {
    local_57 = DObject::IsKindOf((DObject *)flagname.Chars,AActor::RegistrationInfo.MyClass);
  }
  if (local_57 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b4,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b5,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x02') {
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b5,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = VMValue::s(param + 1);
  FString::FString((FString *)&stack0xffffffffffffffc0,other);
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b6,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b6,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  ModActorFlag((AActor *)flagname.Chars,(FString *)&stack0xffffffffffffffc0,param[2].field_0.i != 0,
               true);
  FString::~FString((FString *)&stack0xffffffffffffffc0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeFlag)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(flagname);
	PARAM_BOOL		(value);

	ModActorFlag(self, flagname, value);
	return 0;
}